

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_common.cpp
# Opt level: O0

bool dxil_spv::extract_raw_buffer_access_split
               (Value *index,uint stride,uint32_t addr_shift_log2,uint vecsize,
               RawBufferAccessSplit *split)

{
  BinaryOps BVar1;
  APInt *pAVar2;
  int64_t iVar3;
  byte local_e2;
  bool local_e1;
  ulong local_e0;
  int64_t bias_factor;
  uint64_t scale_factor;
  int64_t local_c8;
  Value *local_c0;
  ConstantInt *local_b8;
  ConstantInt *const_rhs_2;
  ConstantInt *const_lhs_1;
  ConstantInt *const_rhs_1;
  ConstantInt *const_rhs;
  ConstantInt *const_lhs;
  Value *rhs;
  Value *lhs;
  BinaryOperator *binop;
  bool bias_negate;
  bool bias_is_add;
  Constant *pCStack_70;
  bool scale_log2;
  ConstantInt *bias;
  ConstantInt *scale;
  int64_t local_58;
  Value *local_50;
  long local_48;
  int64_t constant_offset;
  ConstantInt *const_addr;
  RawBufferAccessSplit *pRStack_30;
  uint element_size;
  RawBufferAccessSplit *split_local;
  uint32_t local_20;
  uint vecsize_local;
  uint32_t addr_shift_log2_local;
  uint stride_local;
  Value *index_local;
  
  const_addr._4_4_ = (1 << ((byte)addr_shift_log2 & 0x1f)) * vecsize;
  pRStack_30 = split;
  split_local._4_4_ = vecsize;
  local_20 = addr_shift_log2;
  vecsize_local = stride;
  _addr_shift_log2_local = index;
  constant_offset = (int64_t)LLVMBC::dyn_cast<LLVMBC::ConstantInt>(index);
  if ((Constant *)constant_offset == (Constant *)0x0) {
    bias = (ConstantInt *)0x0;
    pCStack_70 = (Constant *)0x0;
    binop._7_1_ = 0;
    binop._6_1_ = 0;
    binop._5_1_ = 0;
    constant_offset = 0;
    while( true ) {
      local_e1 = false;
      if (bias == (ConstantInt *)0x0) {
        local_e1 = LLVMBC::isa<LLVMBC::BinaryOperator>(_addr_shift_log2_local);
      }
      if (local_e1 == false) break;
      lhs = (Value *)LLVMBC::cast<LLVMBC::BinaryOperator>(_addr_shift_log2_local);
      rhs = LLVMBC::Instruction::getOperand((Instruction *)lhs,0);
      const_lhs = (ConstantInt *)LLVMBC::Instruction::getOperand((Instruction *)lhs,1);
      if ((pCStack_70 == (Constant *)0x0) &&
         ((((BVar1 = LLVMBC::BinaryOperator::getOpcode((BinaryOperator *)lhs), BVar1 == Add ||
            (BVar1 = LLVMBC::BinaryOperator::getOpcode((BinaryOperator *)lhs), BVar1 == Sub)) ||
           (BVar1 = LLVMBC::BinaryOperator::getOpcode((BinaryOperator *)lhs), BVar1 == Or)) ||
          (BVar1 = LLVMBC::BinaryOperator::getOpcode((BinaryOperator *)lhs), BVar1 == Xor)))) {
        const_rhs = LLVMBC::dyn_cast<LLVMBC::ConstantInt>(rhs);
        if (&const_rhs->super_Constant == (Constant *)0x0) {
          const_rhs_1 = LLVMBC::dyn_cast<LLVMBC::ConstantInt>((Value *)const_lhs);
          if (&const_rhs_1->super_Constant == (Constant *)0x0) break;
          _addr_shift_log2_local = rhs;
          pCStack_70 = &const_rhs_1->super_Constant;
        }
        else {
          _addr_shift_log2_local = (Value *)const_lhs;
          pCStack_70 = &const_rhs->super_Constant;
        }
        BVar1 = LLVMBC::BinaryOperator::getOpcode((BinaryOperator *)lhs);
        binop._5_1_ = BVar1 == Sub;
        BVar1 = LLVMBC::BinaryOperator::getOpcode((BinaryOperator *)lhs);
        local_e2 = 1;
        if (BVar1 != Add) {
          local_e2 = binop._5_1_;
        }
        binop._6_1_ = local_e2 & 1;
      }
      else {
        BVar1 = LLVMBC::BinaryOperator::getOpcode((BinaryOperator *)lhs);
        if (BVar1 == Shl) {
          const_lhs_1 = LLVMBC::dyn_cast<LLVMBC::ConstantInt>((Value *)const_lhs);
          if (const_lhs_1 == (ConstantInt *)0x0) break;
          _addr_shift_log2_local = rhs;
          binop._7_1_ = 1;
          bias = const_lhs_1;
        }
        else {
          BVar1 = LLVMBC::BinaryOperator::getOpcode((BinaryOperator *)lhs);
          if (BVar1 != Mul) break;
          const_rhs_2 = LLVMBC::dyn_cast<LLVMBC::ConstantInt>(rhs);
          if (const_rhs_2 == (ConstantInt *)0x0) {
            local_b8 = LLVMBC::dyn_cast<LLVMBC::ConstantInt>((Value *)const_lhs);
            if (local_b8 == (ConstantInt *)0x0) break;
            _addr_shift_log2_local = rhs;
            bias = local_b8;
          }
          else {
            _addr_shift_log2_local = (Value *)const_lhs;
            bias = const_rhs_2;
          }
          binop._7_1_ = 0;
        }
      }
    }
    if ((bias == (ConstantInt *)0x0) && (pCStack_70 == (Constant *)0x0)) {
      if (vecsize_local % const_addr._4_4_ == 0) {
        memset(&scale_factor,0,0x18);
        pRStack_30->scale = scale_factor;
        pRStack_30->bias = local_c8;
        pRStack_30->dynamic_index = local_c0;
        pRStack_30->scale = (ulong)vecsize_local / (ulong)const_addr._4_4_;
        pRStack_30->dynamic_index = _addr_shift_log2_local;
        index_local._7_1_ = true;
      }
      else {
        index_local._7_1_ = false;
      }
    }
    else {
      bias_factor = 1;
      if (bias != (ConstantInt *)0x0) {
        pAVar2 = LLVMBC::Constant::getUniqueInteger(&bias->super_Constant);
        bias_factor = LLVMBC::APInt::getZExtValue(pAVar2);
      }
      if ((binop._7_1_ & 1) != 0) {
        bias_factor = 1L << ((byte)bias_factor & 0x3f);
      }
      local_e0 = 0;
      if (pCStack_70 != (Constant *)0x0) {
        pAVar2 = LLVMBC::Constant::getUniqueInteger(pCStack_70);
        local_e0 = LLVMBC::APInt::getSExtValue(pAVar2);
      }
      if ((binop._5_1_ & 1) != 0) {
        local_e0 = -local_e0;
      }
      if (((binop._6_1_ & 1) == 0) && ((bias_factor & local_e0) != 0)) {
        index_local._7_1_ = false;
      }
      else if ((((ulong)vecsize_local * bias_factor) % (ulong)const_addr._4_4_ == 0) &&
              (((long)(vecsize_local * local_e0) % (long)(ulong)const_addr._4_4_ == 0 &&
               (_addr_shift_log2_local != (Value *)0x0)))) {
        pRStack_30->scale = ((ulong)vecsize_local * bias_factor) / (ulong)const_addr._4_4_;
        pRStack_30->bias = (long)(vecsize_local * local_e0) / (long)(int)const_addr._4_4_;
        pRStack_30->dynamic_index = _addr_shift_log2_local;
        index_local._7_1_ = true;
      }
      else {
        index_local._7_1_ = false;
      }
    }
  }
  else {
    pAVar2 = LLVMBC::Constant::getUniqueInteger((Constant *)constant_offset);
    iVar3 = LLVMBC::APInt::getSExtValue(pAVar2);
    local_48 = (ulong)vecsize_local * iVar3;
    if ((split_local._4_4_ == 1) || (local_48 % (long)(int)const_addr._4_4_ == 0)) {
      memset(&scale,0,0x18);
      pRStack_30->scale = (uint64_t)scale;
      pRStack_30->bias = local_58;
      pRStack_30->dynamic_index = local_50;
      pRStack_30->bias = local_48 / (long)(ulong)const_addr._4_4_;
      index_local._7_1_ = true;
    }
    else {
      index_local._7_1_ = false;
    }
  }
  return index_local._7_1_;
}

Assistant:

bool extract_raw_buffer_access_split(const llvm::Value *index, unsigned stride,
                                     uint32_t addr_shift_log2, unsigned vecsize,
                                     RawBufferAccessSplit &split)
{
	unsigned element_size = (1u << addr_shift_log2) * vecsize;

	// Base case first, a constant value.
	if (const auto *const_addr = llvm::dyn_cast<llvm::ConstantInt>(index))
	{
		int64_t constant_offset = const_addr->getUniqueInteger().getSExtValue();
		constant_offset *= stride;

		// Always pass scalar constant dividers through.
		// Building a fallback divider helps nothing.
		if (vecsize == 1 || constant_offset % int(element_size) == 0)
		{
			split = {};
			split.bias = constant_offset / element_size;
			return true;
		}
		else
			return false;
	}

	const llvm::ConstantInt *scale = nullptr;
	const llvm::ConstantInt *bias = nullptr;
	bool scale_log2 = false;
	bool bias_is_add = false;
	bool bias_negate = false;

	while (!scale && llvm::isa<llvm::BinaryOperator>(index))
	{
		auto *binop = llvm::cast<llvm::BinaryOperator>(index);
		auto *lhs = binop->getOperand(0);
		auto *rhs = binop->getOperand(1);
		if (!bias && (binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Add ||
		              binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Sub ||
		              binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Or ||
		              binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Xor))
		{
			if (const auto *const_lhs = llvm::dyn_cast<llvm::ConstantInt>(lhs))
			{
				bias = const_lhs;
				index = rhs;
			}
			else if (const auto *const_rhs = llvm::dyn_cast<llvm::ConstantInt>(rhs))
			{
				bias = const_rhs;
				index = lhs;
			}
			else
				break;

			// DXC tends to be emit shift + or in some cases.
			// We can turn this back into mul + add in most cases.
			bias_negate = binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Sub;
			bias_is_add =
					binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Add ||
					bias_negate;
		}
		else if (binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Shl)
		{
			if (const auto *const_rhs = llvm::dyn_cast<llvm::ConstantInt>(rhs))
			{
				scale = const_rhs;
				index = lhs;
			}
			else
				break;

			scale_log2 = true;
		}
		else if (binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Mul)
		{
			if (const auto *const_lhs = llvm::dyn_cast<llvm::ConstantInt>(lhs))
			{
				scale = const_lhs;
				index = rhs;
			}
			else if (const auto *const_rhs = llvm::dyn_cast<llvm::ConstantInt>(rhs))
			{
				scale = const_rhs;
				index = lhs;
			}
			else
				break;

			scale_log2 = false;
		}
		else
			break;
	}

	if (!scale && !bias)
	{
		// We cannot split anything, but we might be able to vectorize if the stride alone carries us.
		if (stride % element_size == 0)
		{
			split = {};
			split.scale = stride / element_size;
			split.dynamic_index = index;
			return true;
		}
		else
			return false;
	}

	uint64_t scale_factor = 1;
	if (scale)
		scale_factor = scale->getUniqueInteger().getZExtValue();
	if (scale_log2)
		scale_factor = 1ull << scale_factor;

	int64_t bias_factor = 0;
	if (bias)
		bias_factor = bias->getUniqueInteger().getSExtValue();
	if (bias_negate)
		bias_factor = -bias_factor;

	// If there is no bit overlap between scale_factor and bias_factor
	// then the bitwise OR is equivalent to add.
	if (!bias_is_add && (scale_factor & bias_factor) != 0)
		return false;

	scale_factor *= stride;
	bias_factor *= stride;

	if (scale_factor % element_size == 0 && bias_factor % element_size == 0 && index)
	{
		split.scale = scale_factor / element_size;
		split.bias = bias_factor / int(element_size);
		split.dynamic_index = index;
		return true;
	}
	else
		return false;
}